

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::
     lexicographical_compare<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::less<ft::pair<int_const,int>>>
               (treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                *first1,long last1,
               treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
               *first2,long last2)

{
  treeNode<ft::pair<const_int,_int>_> *lhs;
  bool bVar1;
  
  while( true ) {
    lhs = first2->m_node;
    if (first1->m_node == *(treeNode<ft::pair<const_int,_int>_> **)(last1 + 0x10)) {
      return lhs != *(treeNode<ft::pair<const_int,_int>_> **)(last2 + 0x10);
    }
    if ((lhs == *(treeNode<ft::pair<const_int,_int>_> **)(last2 + 0x10)) ||
       (bVar1 = operator<(&lhs->value,&first1->m_node->value), bVar1)) break;
    bVar1 = operator<(&first1->m_node->value,&first2->m_node->value);
    if (bVar1) {
      return true;
    }
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++(first1);
    treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
    ::operator++(first2);
  }
  return false;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}